

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ReadObs(ReadData *this,FILE *file,uchar *HeadBuff)

{
  SATTIME *pSVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint *Message;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  
  if ((this->Head).MessageID != 0x2b) {
    return 6;
  }
  lVar5 = (long)(this->Head).MessageLength;
  sVar6 = lVar5 + 4;
  iVar4 = -1;
  if (-5 < lVar5) {
    iVar4 = (int)sVar6;
  }
  Message = (uint *)operator_new__((long)iVar4);
  sVar6 = fread(Message,sVar6,1,(FILE *)file);
  if (sVar6 == 0) {
    iVar4 = 2;
  }
  else {
    uVar8 = *Message;
    bVar3 = CRCCheck(HeadBuff,(uchar *)Message,(this->Head).MessageLength,uVar8 * 0x2c + 4);
    if (bVar3) {
      for (lVar5 = 0; lVar5 != 0xe00; lVar5 = lVar5 + 0x70) {
        *(undefined8 *)(&this->field_0x1c10 + lVar5) = 0xbff0000000000000;
        *(undefined8 *)((long)(&this->field_0x1c10 + lVar5) + 8) = 0xbff0000000000000;
      }
      for (lVar5 = 0x10; lVar5 != 0x1c10; lVar5 = lVar5 + 0x70) {
        *(undefined8 *)(&this->field_0x0 + lVar5) = 0xbff0000000000000;
        *(undefined8 *)((long)(&this->field_0x0 + lVar5) + 8) = 0xbff0000000000000;
      }
      pSVar1 = &(this->Head).GPST;
      uVar7 = 0;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar7;
      }
      for (; uVar11 * 0x2c - uVar7 != 0; uVar7 = uVar7 + 0x2c) {
        uVar8 = *(uint *)((long)Message + uVar7 + 0x2c);
        uVar9 = uVar8 >> 0x10 & 7;
        if (uVar9 == 0) {
          uVar8 = uVar8 >> 0x15 & 0x1f;
          lVar5 = (ulong)(*(ushort *)((long)Message + uVar7 + 4) - 1 & 0xffff) * 0x70;
          puVar10 = &this->field_0x1c00 + lVar5;
          dVar2 = (this->Head).GPST.SOW;
          *(undefined8 *)(&this->field_0x1c00 + lVar5) = *(undefined8 *)pSVar1;
          *(double *)((long)(&this->field_0x1c00 + lVar5) + 8) = dVar2;
          if (uVar8 != 9) goto LAB_00107028;
LAB_001070bc:
          *(undefined8 *)(puVar10 + 0x18) = *(undefined8 *)((long)Message + uVar7 + 8);
          *(undefined4 *)(puVar10 + 0x24) = *(undefined4 *)((long)Message + uVar7 + 0x10);
          *(undefined8 *)(puVar10 + 0x30) = *(undefined8 *)((long)Message + uVar7 + 0x14);
          *(undefined4 *)(puVar10 + 0x3c) = *(undefined4 *)((long)Message + uVar7 + 0x1c);
          *(undefined4 *)(puVar10 + 0x44) = *(undefined4 *)((long)Message + uVar7 + 0x20);
          *(undefined4 *)(puVar10 + 0x4c) = *(undefined4 *)((long)Message + uVar7 + 0x24);
          *(undefined4 *)(puVar10 + 0x54) = *(undefined4 *)((long)Message + uVar7 + 0x28);
        }
        else if (uVar9 == 4) {
          lVar5 = (ulong)(*(ushort *)((long)Message + uVar7 + 4) - 1 & 0xffff) * 0x70;
          puVar10 = &this->field_0x0 + lVar5;
          dVar2 = (this->Head).GPST.SOW;
          *(undefined8 *)(&this->field_0x0 + lVar5) = *(undefined8 *)pSVar1;
          *(double *)((long)(&this->field_0x0 + lVar5) + 8) = dVar2;
          uVar8 = uVar8 & 0x3600000;
          if (uVar8 == 0x400000) goto LAB_001070bc;
LAB_00107028:
          if (uVar8 == 0) {
            *(undefined8 *)(puVar10 + 0x10) = *(undefined8 *)((long)Message + uVar7 + 8);
            *(undefined4 *)(puVar10 + 0x20) = *(undefined4 *)((long)Message + uVar7 + 0x10);
            *(undefined8 *)(puVar10 + 0x28) = *(undefined8 *)((long)Message + uVar7 + 0x14);
            *(undefined4 *)(puVar10 + 0x38) = *(undefined4 *)((long)Message + uVar7 + 0x1c);
            *(undefined4 *)(puVar10 + 0x40) = *(undefined4 *)((long)Message + uVar7 + 0x20);
            *(undefined4 *)(puVar10 + 0x48) = *(undefined4 *)((long)Message + uVar7 + 0x24);
            *(undefined4 *)(puVar10 + 0x50) = *(undefined4 *)((long)Message + uVar7 + 0x28);
          }
        }
      }
      operator_delete__(Message);
      iVar4 = 0;
    }
    else {
      iVar4 = 3;
    }
  }
  return iVar4;
}

Assistant:

int ReadData::ReadObs(FILE* file, unsigned char* HeadBuff)
{
    if(Head.MessageID != 43)
        return CONFLICT_ID;

    char* buff = new char [Head.MessageLength + 4];
    if(!fread(buff, this->Head.MessageLength + 4, 1, file))
        return FILE_OR_BUFF_END;

    int obsNum = U2I((unsigned char*)(buff), 4);
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, obsNum * 44 + 4))
        return CRC_FAILED;
        
    for(int prn = 0; prn < MAXGPSSRN; ++prn){
        this->GPSObs[prn].psr[0] = -1;
        this->GPSObs[prn].psr[1] = -1;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn){
        this->BDSObs[prn].psr[0] = -1;
        this->BDSObs[prn].psr[1] = -1;
    }
    try
    {
        for(int i = 0; i < obsNum; ++i)
        {
            int ChannelState = U2I((unsigned char*)(buff + i * 44 + 44), 4);
            int sys = (ChannelState >> 16) & 7;
            switch(sys)
            {
                case BDS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->BDSObs[PRN].ObsTime = Head.GPST;

                    // B1 signal
                    if(SignalType == 0 || SignalType == 4)
                    {
                        this->BDSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // B3 signal
                    if(SignalType == 2 || SignalType == 6)
                    {
                        this->BDSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                case GPS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->GPSObs[PRN].ObsTime = Head.GPST;
                    // L1 C/A
                    if(SignalType == 0)
                    {
                        this->GPSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // L2P
                    if(SignalType == 9)
                    {
                        this->GPSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                default: break;
            }
        }
    }
    catch(...)
    {
        cout << "error happened when reading obs" << endl;
        return -1;
    }
    delete[] buff;
    return 0;
    
}